

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

unsigned_long_long kj::anon_unknown_55::parseUnsigned(StringPtr *s,unsigned_long_long max)

{
  char cVar1;
  char *pcVar2;
  int __base;
  ulong uVar3;
  StringPtr *pSVar4;
  Fault *this;
  bool bVar5;
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> _kjCondition;
  Fault f_1;
  unsigned_long_long value;
  char *endPtr;
  unsigned_long_long max_local;
  
  _kjCondition.right = (void *)0x0;
  bVar5 = (s->content).size_ < 2;
  _kjCondition.result = !bVar5;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = s;
  max_local = max;
  if (bVar5) {
    this = (Fault *)&endPtr;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr_const&,decltype(nullptr)>&,char_const(&)[37],kj::StringPtr_const&>
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x40,FAILED,"s != nullptr",
               "_kjCondition,\"String does not contain valid number\", s",&_kjCondition,
               (char (*) [37])"String does not contain valid number",s);
  }
  else {
    pSVar4 = (StringPtr *)__errno_location();
    *(int *)&(pSVar4->content).ptr = 0;
    pcVar2 = (s->content).ptr;
    bVar5 = isHex(pcVar2);
    __base = 10;
    if (bVar5) {
      __base = 0x10;
    }
    value = strtoull(pcVar2,&endPtr,__base);
    pcVar2 = (s->content).ptr;
    _kjCondition.right = pcVar2 + ((s->content).size_ - 1);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.result = endPtr == (char *)_kjCondition.right;
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      bVar5 = *(int *)&(pSVar4->content).ptr == 0x22;
      uVar3 = (ulong)_kjCondition.right >> 0x20;
      _kjCondition.right = (void *)CONCAT44((int)uVar3,0x22);
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = !bVar5;
      if (bVar5) {
        this = &f_1;
        _kjCondition.left = pSVar4;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[19],kj::StringPtr_const&>
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                   ,0x45,FAILED,"errno != ERANGE","_kjCondition,\"Value out-of-range\", s",
                   (DebugComparison<int_&,_int> *)&_kjCondition,(char (*) [19])"Value out-of-range",
                   s);
      }
      else {
        _kjCondition.left = (StringPtr *)&value;
        _kjCondition.right = &max_local;
        _kjCondition.op.content.ptr = " <= ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = value <= max;
        if (max < value) {
          this = &f_1;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long_long&,unsigned_long_long&>&,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                     ,0x46,FAILED,"value <= max","_kjCondition,\"Value out-of-range\", value, max",
                     (DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> *)&_kjCondition,
                     (char (*) [19])"Value out-of-range",(unsigned_long_long *)_kjCondition.left,
                     (unsigned_long_long *)_kjCondition.right);
        }
        else {
          cVar1 = *pcVar2;
          uVar3 = (ulong)_kjCondition.left >> 0x10;
          _kjCondition.left._2_6_ = (undefined6)uVar3;
          _kjCondition.left._0_2_ = CONCAT11(0x2d,cVar1);
          _kjCondition.right = anon_var_dwarf_1f341;
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = (size_t)(cVar1 != '-');
          if (cVar1 != '-') {
            return value;
          }
          this = &f_1;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<char,char>&,char_const(&)[19],kj::StringPtr_const&>
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                     ,0x48,FAILED,"s[0] != \'-\'","_kjCondition,\"Value out-of-range\", s",
                     (DebugComparison<char,_char> *)&_kjCondition,
                     (char (*) [19])"Value out-of-range",s);
        }
      }
    }
    else {
      this = &f_1;
      _kjCondition.left = (StringPtr *)&endPtr;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[37],kj::StringPtr_const&>
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x44,FAILED,"endPtr == s.end()",
                 "_kjCondition,\"String does not contain valid number\", s",
                 (DebugComparison<char_*&,_const_char_*> *)&_kjCondition,
                 (char (*) [37])"String does not contain valid number",s);
    }
  }
  kj::_::Debug::Fault::~Fault(this);
  return 0;
}

Assistant:

unsigned long long parseUnsigned(const StringPtr& s, unsigned long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value <= max, "Value out-of-range", value, max) { return 0; }
  //strtoull("-1") does not fail with ERANGE
  KJ_REQUIRE(s[0] != '-', "Value out-of-range", s) { return 0; }
  return value;
}